

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O2

void __thiscall
absl::lts_20250127::inlined_vector_internal::
Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
::DestroyContents(Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
                  *this)

{
  ulong uVar1;
  Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_> destroy_first;
  
  uVar1 = (this->metadata_).
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
          .super_Storage<unsigned_long,_1UL,_false>.value;
  if ((uVar1 & 1) == 0) {
    destroy_first =
         (Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_>)&this->data_;
  }
  else {
    destroy_first = (this->data_).allocated.allocated_data;
  }
  DestroyAdapter<std::allocator<absl::lts_20250127::status_internal::Payload>,_false>::
  DestroyElements((allocator<absl::lts_20250127::status_internal::Payload> *)this,destroy_first,
                  uVar1 >> 1);
  DeallocateIfAllocated(this);
  return;
}

Assistant:

void Storage<T, N, A>::DestroyContents() {
  Pointer<A> data = GetIsAllocated() ? GetAllocatedData() : GetInlinedData();
  DestroyAdapter<A>::DestroyElements(GetAllocator(), data, GetSize());
  DeallocateIfAllocated();
}